

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

void __thiscall
helics::FirewallOperator::FirewallOperator
          (FirewallOperator *this,function<bool_(const_helics::Message_*)> *userCheckFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__FirewallOperator_0052cae0;
  *(undefined8 *)&(this->checkFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->checkFunction).super__Function_base._M_functor + 8) = 0;
  (this->checkFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->checkFunction)._M_invoker = userCheckFunction->_M_invoker;
  if ((userCheckFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userCheckFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->checkFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userCheckFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->checkFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->checkFunction).super__Function_base._M_manager =
         (userCheckFunction->super__Function_base)._M_manager;
    (userCheckFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userCheckFunction->_M_invoker = (_Invoker_type)0x0;
  }
  (this->operation)._M_i = drop;
  return;
}

Assistant:

FirewallOperator::FirewallOperator(std::function<bool(const Message*)> userCheckFunction):
    checkFunction(std::move(userCheckFunction))
{
}